

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

ssl_ticket_aead_result_t __thiscall
bssl::ssl_process_ticket
          (bssl *this,SSL_HANDSHAKE *hs,UniquePtr<SSL_SESSION> *out_session,bool *out_renew_ticket,
          Span<const_unsigned_char> ticket,Span<const_unsigned_char> session_id)

{
  SSL *ssl_00;
  Span<const_unsigned_char> ticket_00;
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  size_t sVar4;
  Array<unsigned_char> *pAVar5;
  uchar *puVar6;
  size_t sVar7;
  pointer psVar8;
  SSL_SESSION *__p;
  pointer psVar9;
  uchar *md;
  Span<const_unsigned_char> ticket_01;
  Span<const_unsigned_char> ticket_02;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_f8;
  UniquePtr<SSL_SESSION> session;
  Span<const_unsigned_char> local_d8;
  SSL_HANDSHAKE *local_c8;
  uchar *puStack_c0;
  SSL_HANDSHAKE *local_b8;
  uchar *puStack_b0;
  SSL_HANDSHAKE *local_a8;
  uchar *puStack_a0;
  Span<const_unsigned_char> local_98;
  Span<const_unsigned_char> local_88 [2];
  pointer local_68;
  SSL_HANDSHAKE_HINTS *hints;
  undefined1 local_58 [4];
  ssl_ticket_aead_result_t result;
  Array<unsigned_char> plaintext;
  bool is_psk;
  SSL *ssl;
  bool *out_renew_ticket_local;
  UniquePtr<SSL_SESSION> *out_session_local;
  SSL_HANDSHAKE *hs_local;
  Span<const_unsigned_char> ticket_local;
  
  sVar7 = ticket.size_;
  ticket_local.data_ = ticket.data_;
  ssl_00 = *(SSL **)this;
  *(undefined1 *)
   &(out_session->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl = 0;
  hs_local = (SSL_HANDSHAKE *)out_renew_ticket;
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::reset
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)hs,(pointer)0x0);
  uVar3 = SSL_get_options(*(SSL **)this);
  if (((uVar3 & 0x4000) != 0) ||
     (sVar4 = Span<const_unsigned_char>::size(&session_id), 0x20 < sVar4)) {
    return ssl_ticket_aead_ignore_ticket;
  }
  uVar2 = ssl_protocol_version(ssl_00);
  plaintext.size_._7_1_ = 0x303 < uVar2;
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_58);
  local_68 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::get
                       ((unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter> *)
                        (this + 0x6c0));
  if (((((plaintext.size_._7_1_ & 1) == 0) || (local_68 == (pointer)0x0)) ||
      ((*(uint *)(this + 0x6c8) >> 0x14 & 1) != 0)) ||
     (bVar1 = Array<unsigned_char>::empty(&local_68->decrypted_psk), bVar1)) {
    if ((((plaintext.size_._7_1_ & 1) == 0) || (local_68 == (pointer)0x0)) ||
       (((*(uint *)(this + 0x6c8) >> 0x14 & 1) != 0 || ((local_68->ignore_psk & 1U) == 0)))) {
      if ((((plaintext.size_._7_1_ & 1) != 0) || (local_68 == (pointer)0x0)) ||
         (((*(uint *)(this + 0x6c8) >> 0x14 & 1) != 0 ||
          (bVar1 = Array<unsigned_char>::empty(&local_68->decrypted_ticket), bVar1)))) {
        if (((((plaintext.size_._7_1_ & 1) == 0) && (local_68 != (pointer)0x0)) &&
            ((*(uint *)(this + 0x6c8) >> 0x14 & 1) == 0)) && ((local_68->ignore_ticket & 1U) != 0))
        {
          hints._4_4_ = ssl_ticket_aead_ignore_ticket;
        }
        else {
          psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                             (&ssl_00->session_ctx);
          if (psVar8->ticket_aead_method == (SSL_TICKET_AEAD_METHOD *)0x0) {
            sVar4 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&hs_local);
            if (sVar4 < 0x20) {
              hints._4_4_ = ssl_ticket_aead_ignore_ticket;
            }
            else {
              psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                                 (&ssl_00->session_ctx);
              if (psVar8->ticket_key_cb ==
                  (_func_int_SSL_ptr_uint8_t_ptr_uint8_t_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *)
                  0x0) {
                local_c8 = hs_local;
                puStack_c0 = ticket_local.data_;
                ticket_00.size_ = (size_t)ticket_local.data_;
                ticket_00.data_ = (uchar *)hs_local;
                hints._4_4_ = ssl_decrypt_ticket_with_ticket_keys
                                        ((SSL_HANDSHAKE *)this,(Array<unsigned_char> *)local_58,
                                         ticket_00);
              }
              else {
                local_b8 = hs_local;
                puStack_b0 = ticket_local.data_;
                ticket_02.size_ = sVar7;
                ticket_02.data_ = ticket_local.data_;
                hints._4_4_ = ssl_decrypt_ticket_with_cb
                                        (this,(SSL_HANDSHAKE *)local_58,
                                         (Array<unsigned_char> *)out_session,(bool *)hs_local,
                                         ticket_02);
              }
            }
          }
          else {
            local_a8 = hs_local;
            puStack_a0 = ticket_local.data_;
            ticket_01.size_ = sVar7;
            ticket_01.data_ = ticket_local.data_;
            hints._4_4_ = ssl_decrypt_ticket_with_method
                                    (this,(SSL_HANDSHAKE *)local_58,
                                     (Array<unsigned_char> *)out_session,(bool *)hs_local,ticket_01)
            ;
          }
        }
      }
      else {
        Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_98,&local_68->decrypted_ticket);
        bVar1 = Array<unsigned_char>::CopyFrom((Array<unsigned_char> *)local_58,local_98);
        if (bVar1) {
          hints._4_4_ = ssl_ticket_aead_success;
          *(byte *)&(out_session->_M_t).
                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
               local_68->renew_ticket & 1;
        }
        else {
          hints._4_4_ = ssl_ticket_aead_error;
        }
      }
    }
    else {
      hints._4_4_ = ssl_ticket_aead_ignore_ticket;
    }
  }
  else {
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)local_88,&local_68->decrypted_psk);
    bVar1 = Array<unsigned_char>::CopyFrom((Array<unsigned_char> *)local_58,local_88[0]);
    hints._4_4_ = ssl_ticket_aead_error;
    if (bVar1) {
      hints._4_4_ = ssl_ticket_aead_success;
    }
  }
  if ((local_68 != (pointer)0x0) && ((*(uint *)(this + 0x6c8) >> 0x14 & 1) != 0)) {
    if (hints._4_4_ == ssl_ticket_aead_ignore_ticket) {
      if ((plaintext.size_._7_1_ & 1) == 0) {
        local_68->ignore_ticket = true;
      }
      else {
        local_68->ignore_psk = true;
      }
    }
    else if (hints._4_4_ == ssl_ticket_aead_success) {
      if ((plaintext.size_._7_1_ & 1) == 0) {
        pAVar5 = &local_68->decrypted_ticket;
        Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  ((Span<unsigned_char_const> *)&session,(Array<unsigned_char> *)local_58);
        bVar1 = Array<unsigned_char>::CopyFrom(pAVar5,_session);
        if (!bVar1) {
          ticket_local.size_._4_4_ = ssl_ticket_aead_error;
          goto LAB_001676fa;
        }
        local_68->renew_ticket =
             (bool)(*(byte *)&(out_session->_M_t).
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl & 1);
      }
      else {
        pAVar5 = &local_68->decrypted_psk;
        Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_d8,(Array<unsigned_char> *)local_58);
        bVar1 = Array<unsigned_char>::CopyFrom(pAVar5,local_d8);
        if (!bVar1) {
          ticket_local.size_._4_4_ = ssl_ticket_aead_error;
          goto LAB_001676fa;
        }
      }
    }
  }
  if (hints._4_4_ == ssl_ticket_aead_success) {
    puVar6 = Array<unsigned_char>::data((Array<unsigned_char> *)local_58);
    sVar7 = Array<unsigned_char>::size((Array<unsigned_char> *)local_58);
    psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&ssl_00->ctx);
    __p = SSL_SESSION_from_bytes(puVar6,sVar7,psVar8);
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)&local_f8,__p);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_f8);
    if (bVar1) {
      psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_f8);
      InplaceVector<unsigned_char,_32UL>::ResizeForOverwrite(&psVar9->session_id,0x20);
      puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&hs_local);
      sVar7 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&hs_local);
      psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_f8);
      md = InplaceVector<unsigned_char,_32UL>::data(&psVar9->session_id);
      SHA256(puVar6,sVar7,md);
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)hs,&local_f8);
      ticket_local.size_._4_4_ = ssl_ticket_aead_success;
    }
    else {
      ERR_clear_error();
      ticket_local.size_._4_4_ = ssl_ticket_aead_ignore_ticket;
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_f8);
  }
  else {
    ticket_local.size_._4_4_ = hints._4_4_;
  }
LAB_001676fa:
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_58);
  return ticket_local.size_._4_4_;
}

Assistant:

enum ssl_ticket_aead_result_t ssl_process_ticket(
    SSL_HANDSHAKE *hs, UniquePtr<SSL_SESSION> *out_session,
    bool *out_renew_ticket, Span<const uint8_t> ticket,
    Span<const uint8_t> session_id) {
  SSL *const ssl = hs->ssl;
  *out_renew_ticket = false;
  out_session->reset();

  if ((SSL_get_options(hs->ssl) & SSL_OP_NO_TICKET) ||
      session_id.size() > SSL_MAX_SSL_SESSION_ID_LENGTH) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // Tickets in TLS 1.3 are tied into pre-shared keys (PSKs), unlike in TLS 1.2
  // where that concept doesn't exist. The |decrypted_psk| and |ignore_psk|
  // hints only apply to PSKs. We check the version to determine which this is.
  const bool is_psk = ssl_protocol_version(ssl) >= TLS1_3_VERSION;

  Array<uint8_t> plaintext;
  enum ssl_ticket_aead_result_t result;
  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  if (is_psk && hints && !hs->hints_requested &&
      !hints->decrypted_psk.empty()) {
    result = plaintext.CopyFrom(hints->decrypted_psk) ? ssl_ticket_aead_success
                                                      : ssl_ticket_aead_error;
  } else if (is_psk && hints && !hs->hints_requested && hints->ignore_psk) {
    result = ssl_ticket_aead_ignore_ticket;
  } else if (!is_psk && hints && !hs->hints_requested &&
             !hints->decrypted_ticket.empty()) {
    if (plaintext.CopyFrom(hints->decrypted_ticket)) {
      result = ssl_ticket_aead_success;
      *out_renew_ticket = hints->renew_ticket;
    } else {
      result = ssl_ticket_aead_error;
    }
  } else if (!is_psk && hints && !hs->hints_requested && hints->ignore_ticket) {
    result = ssl_ticket_aead_ignore_ticket;
  } else if (ssl->session_ctx->ticket_aead_method != NULL) {
    result = ssl_decrypt_ticket_with_method(hs, &plaintext, out_renew_ticket,
                                            ticket);
  } else {
    // Ensure there is room for the key name and the largest IV |ticket_key_cb|
    // may try to consume. The real limit may be lower, but the maximum IV
    // length should be well under the minimum size for the session material and
    // HMAC.
    if (ticket.size() < SSL_TICKET_KEY_NAME_LEN + EVP_MAX_IV_LENGTH) {
      result = ssl_ticket_aead_ignore_ticket;
    } else if (ssl->session_ctx->ticket_key_cb != NULL) {
      result =
          ssl_decrypt_ticket_with_cb(hs, &plaintext, out_renew_ticket, ticket);
    } else {
      result = ssl_decrypt_ticket_with_ticket_keys(hs, &plaintext, ticket);
    }
  }

  if (hints && hs->hints_requested) {
    if (result == ssl_ticket_aead_ignore_ticket) {
      if (is_psk) {
        hints->ignore_psk = true;
      } else {
        hints->ignore_ticket = true;
      }
    } else if (result == ssl_ticket_aead_success) {
      if (is_psk) {
        if (!hints->decrypted_psk.CopyFrom(plaintext)) {
          return ssl_ticket_aead_error;
        }
      } else {
        if (!hints->decrypted_ticket.CopyFrom(plaintext)) {
          return ssl_ticket_aead_error;
        }
        hints->renew_ticket = *out_renew_ticket;
      }
    }
  }

  if (result != ssl_ticket_aead_success) {
    return result;
  }

  // Decode the session.
  UniquePtr<SSL_SESSION> session(SSL_SESSION_from_bytes(
      plaintext.data(), plaintext.size(), ssl->ctx.get()));
  if (!session) {
    ERR_clear_error();  // Don't leave an error on the queue.
    return ssl_ticket_aead_ignore_ticket;
  }

  // Envoy's tests expect the session to have a session ID that matches the
  // placeholder used by the client. It's unclear whether this is a good idea,
  // but we maintain it for now.
  session->session_id.ResizeForOverwrite(SHA256_DIGEST_LENGTH);
  SHA256(ticket.data(), ticket.size(), session->session_id.data());

  *out_session = std::move(session);
  return ssl_ticket_aead_success;
}